

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O0

_Bool ckh_try_insert(ckh_t *ckh,void **argkey,void **argdata)

{
  void *key_00;
  void *data_00;
  _Bool _Var1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  ckh_t *in_RDI;
  void **unaff_retaddr;
  void *data;
  void *key;
  size_t bucket;
  size_t hashes [2];
  ulong local_38;
  ulong local_30;
  ckh_t *local_10;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  key_00 = (void *)*in_RSI;
  data_00 = (void *)*in_RDX;
  local_10 = in_RDI;
  (*in_RDI->hash)(key_00,&local_38);
  _Var1 = ckh_try_bucket_insert
                    (local_10,local_38 & (1L << ((byte)local_10->lg_curbuckets & 0x3f)) - 1U,key_00,
                     data_00);
  if (_Var1) {
    _Var1 = ckh_try_bucket_insert
                      (local_10,local_30 & (1L << ((byte)local_10->lg_curbuckets & 0x3f)) - 1U,
                       key_00,data_00);
    if (_Var1) {
      _Var1 = ckh_evict_reloc_insert
                        ((ckh_t *)key,(size_t)data,unaff_retaddr,
                         (void **)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    }
    else {
      _Var1 = false;
    }
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool
ckh_try_insert(ckh_t *ckh, void const**argkey, void const**argdata) {
	size_t hashes[2], bucket;
	const void *key = *argkey;
	const void *data = *argdata;

	ckh->hash(key, hashes);

	/* Try to insert in primary bucket. */
	bucket = hashes[0] & ((ZU(1) << ckh->lg_curbuckets) - 1);
	if (!ckh_try_bucket_insert(ckh, bucket, key, data)) {
		return false;
	}

	/* Try to insert in secondary bucket. */
	bucket = hashes[1] & ((ZU(1) << ckh->lg_curbuckets) - 1);
	if (!ckh_try_bucket_insert(ckh, bucket, key, data)) {
		return false;
	}

	/*
	 * Try to find a place for this item via iterative eviction/relocation.
	 */
	return ckh_evict_reloc_insert(ckh, bucket, argkey, argdata);
}